

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

Port * __thiscall
kratos::Generator::port(Generator *this,Port *p,string *port_name,bool check_param)

{
  bool bVar1;
  PortDirection direction;
  uint32_t width;
  PortType type;
  uint uVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *size;
  Port *this_00;
  Port *p_;
  bool check_param_local;
  string *port_name_local;
  Port *p_local;
  Generator *this_local;
  
  direction = Port::port_direction(p);
  width = Var::var_width(&p->super_Var);
  size = Var::size(&p->super_Var);
  type = Port::port_type(p);
  bVar1 = Var::is_signed(&p->super_Var);
  this_00 = port(this,direction,port_name,width,size,type,bVar1);
  bVar1 = Var::explicit_array(&p->super_Var);
  Var::set_explicit_array(&this_00->super_Var,bVar1);
  uVar2 = (*(p->super_Var).super_IRNode._vptr_IRNode[0x18])();
  (*(this_00->super_Var).super_IRNode._vptr_IRNode[0x19])(this_00,(ulong)(uVar2 & 1));
  Var::copy_meta_data(&p->super_Var,&this_00->super_Var,check_param);
  return this_00;
}

Assistant:

Port &Generator::port(const Port &p, const std::string &port_name, bool check_param) {
    auto &p_ =
        port(p.port_direction(), port_name, p.var_width(), p.size(), p.port_type(), p.is_signed());
    p_.set_explicit_array(p.explicit_array());
    p_.set_is_packed(p.is_packed());
    // need to copy other definition over
    p.copy_meta_data(&p_, check_param);
    return p_;
}